

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UnicodeString * icu_63::ICUServiceKey::parsePrefix(UnicodeString *result)

{
  undefined4 local_14;
  int32_t n;
  UnicodeString *result_local;
  
  local_14 = icu_63::UnicodeString::indexOf(result,L'/');
  if ((int)local_14 < 0) {
    local_14 = 0;
  }
  icu_63::UnicodeString::remove(result,(char *)(ulong)local_14);
  return result;
}

Assistant:

UnicodeString& 
ICUServiceKey::parsePrefix(UnicodeString& result) 
{
    int32_t n = result.indexOf(PREFIX_DELIMITER);
    if (n < 0) {
        n = 0;
    }
    result.remove(n);
    return result;
}